

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

void secp256k1_musig_aggnonce_save(secp256k1_musig_aggnonce *nonce,secp256k1_ge *ges)

{
  uchar *puVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  secp256k1_ge_storage s;
  secp256k1_ge_storage local_68;
  
  nonce->data[0] = 0xa8;
  nonce->data[1] = 0xb7;
  nonce->data[2] = 0xe4;
  nonce->data[3] = 'g';
  lVar3 = 0;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    if (ges[lVar3].infinity == 0) {
      secp256k1_ge_to_storage(&local_68,ges + lVar3);
      *(uint64_t *)(nonce->data + lVar3 * 0x40 + 0x34) = local_68.y.n[2];
      *(uint64_t *)(nonce->data + lVar3 * 0x40 + 0x3c) = local_68.y.n[3];
      *(uint64_t *)(nonce->data + lVar3 * 0x40 + 0x24) = local_68.y.n[0];
      *(uint64_t *)(nonce->data + lVar3 * 0x40 + 0x2c) = local_68.y.n[1];
      *(uint64_t *)(nonce->data + lVar3 * 0x40 + 0x14) = local_68.x.n[2];
      *(uint64_t *)(nonce->data + lVar3 * 0x40 + 0x1c) = local_68.x.n[3];
      uVar5 = (undefined4)local_68.x.n[0];
      uVar6 = local_68.x.n[0]._4_4_;
      uVar7 = (undefined4)local_68.x.n[1];
      uVar8 = local_68.x.n[1]._4_4_;
    }
    else {
      puVar1 = nonce->data + lVar3 * 0x40 + 0x34;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      puVar1 = nonce->data + lVar3 * 0x40 + 0x3c;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      puVar1 = nonce->data + lVar3 * 0x40 + 0x24;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      puVar1 = nonce->data + lVar3 * 0x40 + 0x2c;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      puVar1 = nonce->data + lVar3 * 0x40 + 0x14;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      puVar1 = nonce->data + lVar3 * 0x40 + 0x1c;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      uVar5 = 0;
      uVar6 = 0;
      uVar7 = 0;
      uVar8 = 0;
    }
    *(undefined4 *)(nonce->data + lVar3 * 0x40 + 4) = uVar5;
    *(undefined4 *)(nonce->data + lVar3 * 0x40 + 8) = uVar6;
    *(undefined4 *)(nonce->data + lVar3 * 0x40 + 0xc) = uVar7;
    *(undefined4 *)(nonce->data + lVar3 * 0x40 + 0x10) = uVar8;
    lVar3 = 1;
    bVar2 = false;
  } while (bVar4);
  return;
}

Assistant:

static void secp256k1_musig_aggnonce_save(secp256k1_musig_aggnonce* nonce, const secp256k1_ge* ges) {
    int i;
    memcpy(&nonce->data[0], secp256k1_musig_aggnonce_magic, 4);
    for (i = 0; i < 2; i++) {
        secp256k1_ge_to_bytes_ext(&nonce->data[4 + 64*i], &ges[i]);
    }
}